

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorTiledImage::RenderElement
          (DecoratorTiledImage *this,Element *element,DecoratorDataHandle element_data)

{
  Vector2f VVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  CompiledShader local_38;
  undefined1 local_28 [16];
  
  VVar1 = Element::GetAbsoluteOffset(element,Border);
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_4_ = VVar1.x;
  local_28._4_4_ = VVar1.y;
  local_28._12_4_ = extraout_XMM0_Dd;
  texture = Decorator::GetTexture((Decorator *)this,0);
  local_38.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)0x0;
  local_38.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0;
  Geometry::Render((Geometry *)element_data,(Vector2f)local_28._0_8_,texture,&local_38);
  CompiledShader::Release(&local_38);
  return;
}

Assistant:

void DecoratorTiledImage::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	Geometry* data = reinterpret_cast<Geometry*>(element_data);
	data->Render(element->GetAbsoluteOffset(BoxArea::Border), GetTexture());
}